

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primvar.hh
# Opt level: O2

bool __thiscall
tinyusdz::primvar::PrimVar::get_interpolated_value<tinyusdz::value::normal3h>
          (PrimVar *this,double t,TimeSampleInterpolationType tinterp,normal3h *v)

{
  half hVar1;
  bool bVar2;
  pointer pSVar3;
  value_type *pvVar4;
  pointer pSVar5;
  optional<tinyusdz::value::normal3h> pv;
  optional<tinyusdz::value::normal3h> local_38;
  optional<tinyusdz::value::normal3h> local_30;
  double local_28;
  
  if (v == (normal3h *)0x0) {
    return false;
  }
  if (NAN(t)) {
    local_28 = t;
    get_default_value<tinyusdz::value::normal3h>(&local_38,this);
    local_30.has_value_ = local_38.has_value_;
    if (local_38.has_value_ == true) goto LAB_001c010a;
    pSVar3 = (this->_ts)._samples.
             super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pSVar5 = (this->_ts)._samples.
             super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    t = local_28;
    if (pSVar3 == pSVar5) {
      return false;
    }
  }
  else {
    pSVar3 = (this->_ts)._samples.
             super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pSVar5 = (this->_ts)._samples.
             super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  }
  if (pSVar5 != pSVar3) {
    bVar2 = tinyusdz::value::TimeSamples::get<tinyusdz::value::normal3h,_nullptr>
                      (&this->_ts,v,t,tinterp);
    return bVar2;
  }
  bVar2 = has_value(this);
  if (bVar2) {
    get_default_value<tinyusdz::value::normal3h>(&local_38,this);
    local_30.has_value_ = local_38.has_value_;
    if (local_38.has_value_ != false) {
LAB_001c010a:
      local_30.contained._4_2_ = local_38.contained._4_2_;
      local_30.contained._0_4_ = local_38.contained._0_4_;
      pvVar4 = nonstd::optional_lite::optional<tinyusdz::value::normal3h>::value(&local_30);
      hVar1.value = (pvVar4->y).value;
      v->x = (half)(pvVar4->x).value;
      v->y = (half)hVar1.value;
      (v->z).value = (pvVar4->z).value;
      return true;
    }
  }
  return false;
}

Assistant:

bool get_interpolated_value(const double t, const value::TimeSampleInterpolationType tinterp, T *v) const {
    if (!v) {
      return false;
    }

    if (value::TimeCode(t).is_default()) {

      if (auto pv = get_default_value<T>()) {
        (*v) = pv.value();
        return true;
      }

      if (_ts.empty()) {
        return false;
      }
    }

    if (has_timesamples()) {
      return _ts.get(v, t, tinterp);
    }

    if (has_default()) {
      if (auto pv = get_default_value<T>()) {
        (*v) = pv.value();
        return true;
      }
    }

    return false;
  }